

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

EscapeSequence duckdb::Terminal::ReadEscapeSequence(int ifd)

{
  idx_t iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char seq [5];
  undefined4 local_3d;
  char local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  iVar1 = ReadEscapeSequence(ifd,(char *)&local_3d);
  if (iVar1 == 0) {
    return INVALID;
  }
  local_38[0] = local_28;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"escape of length %d\n","");
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  switch(iVar1) {
  case 1:
    uVar2 = local_3d & 0xff;
    if ((byte)((char)local_3d + 0x9fU) < 0x1a) {
      return uVar2 - 0x54;
    }
    if ((byte)((char)local_3d + 0xbfU) < 0x1a) {
      return uVar2 - (ALT_T|ALT_H);
    }
    local_3d = local_3d & 0xff;
    if (local_3d < 0x3e) {
      if (local_3d == 0x1b) {
        return ESCAPE;
      }
      if (uVar2 == 0x3c) {
        return ALT_LEFT_ARROW;
      }
    }
    else {
      if (uVar2 == 0x3e) {
        return ALT_RIGHT_ARROW;
      }
      if (local_3d == 0x5c) {
        return ALT_BACKSLASH;
      }
      if (local_3d == 0x7f) {
        return ALT_BACKSPACE;
      }
    }
    pcVar4 = "unrecognized escape sequence of length 1 - %d\n";
    pcVar3 = "";
    break;
  case 2:
    if ((local_3d & 0xff) == 0x5b) {
      switch(local_3d._1_1_) {
      case 0x41:
LAB_0021c8dd:
        return UP;
      case 0x42:
LAB_0021c8dd:
        return DOWN;
      case 0x43:
LAB_0021c8dd:
        return RIGHT;
      case 0x44:
LAB_0021c8dd:
        return LEFT;
      case 0x46:
LAB_0021c8dd:
        return END;
      case 0x48:
LAB_0021c8dd:
        return HOME;
      default:
        if (local_3d._1_1_ == 0x5a) {
          return SHIFT_TAB;
        }
      case 0x45:
      case 0x47:
        pcVar4 = "unrecognized escape sequence (seq[1]) %d\n";
        pcVar3 = "";
      }
    }
    else if ((local_3d & 0xff) == 0x4f) {
      switch(local_3d._1_1_) {
      case 0x41:
        goto LAB_0021c8dd;
      case 0x42:
        goto LAB_0021c8dd;
      case 0x43:
        goto LAB_0021c8dd;
      case 0x44:
        goto LAB_0021c8dd;
      case 0x46:
        goto LAB_0021c8dd;
      case 0x48:
        goto LAB_0021c8dd;
      default:
        if (local_3d._1_1_ == 99) {
          return ALT_F;
        }
        if (local_3d._1_1_ == 100) {
          return ALT_B;
        }
      case 0x45:
      case 0x47:
        pcVar4 = "unrecognized escape sequence (O) %d\n";
        pcVar3 = "";
      }
    }
    else {
      pcVar4 = "unrecognized escape sequence of length %d (%d %d)\n";
      pcVar3 = "";
    }
    break;
  case 3:
    if (local_3d._2_1_ == '~') {
      local_3d._1_1_ = local_3d._1_1_ - 0x31;
      if ((local_3d._1_1_ < 8) && ((0x8dU >> (local_3d._1_1_ & 0x1f) & 1) != 0)) {
        return *(EscapeSequence *)(&DAT_012acfb8 + (ulong)local_3d._1_1_ * 4);
      }
      pcVar4 = "unrecognized escape sequence (~) %d\n";
      pcVar3 = "";
      break;
    }
    if (local_3d._2_1_ == 'C' && (local_3d._1_1_ ^ 0x35) == 0) {
      return ALT_F;
    }
    if (local_3d._2_1_ == 'D' && (local_3d._1_1_ ^ 0x35) == 0) {
      return ALT_B;
    }
  default:
    pcVar4 = "unrecognized escape sequence of length %d\n";
    pcVar3 = "";
    break;
  case 5:
    if (local_39 == 'C' && local_3d == 0x353b315b) {
      return CTRL_MOVE_FORWARDS;
    }
    if (local_39 == 'C' && local_3d == 0x333b315b) {
      return CTRL_MOVE_FORWARDS;
    }
    if (local_39 == 'D' && local_3d == 0x353b315b) {
      return CTRL_MOVE_BACKWARDS;
    }
    if (local_39 == 'D' && local_3d == 0x333b315b) {
      return CTRL_MOVE_BACKWARDS;
    }
    pcVar4 = "unrecognized escape sequence (;) %d\n";
    pcVar3 = "";
  }
  local_38[0] = local_28;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_38,pcVar4,pcVar3);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return UNKNOWN;
}

Assistant:

EscapeSequence Terminal::ReadEscapeSequence(int ifd) {
	char seq[5];
	idx_t length = ReadEscapeSequence(ifd, seq);
	if (length == 0) {
		return EscapeSequence::INVALID;
	}
	Linenoise::Log("escape of length %d\n", length);
	switch (length) {
	case 1:
		if (seq[0] >= 'a' && seq[0] <= 'z') {
			return EscapeSequence(idx_t(EscapeSequence::ALT_A) + (seq[0] - 'a'));
		}
		if (seq[0] >= 'A' && seq[0] <= 'Z') {
			return EscapeSequence(idx_t(EscapeSequence::ALT_A) + (seq[0] - 'A'));
		}
		switch (seq[0]) {
		case BACKSPACE:
			return EscapeSequence::ALT_BACKSPACE;
		case ESC:
			return EscapeSequence::ESCAPE;
		case '<':
			return EscapeSequence::ALT_LEFT_ARROW;
		case '>':
			return EscapeSequence::ALT_RIGHT_ARROW;
		case '\\':
			return EscapeSequence::ALT_BACKSLASH;
		default:
			Linenoise::Log("unrecognized escape sequence of length 1 - %d\n", seq[0]);
			break;
		}
		break;
	case 2:
		if (seq[0] == 'O') {
			switch (seq[1]) {
			case 'A': /* Up */
				return EscapeSequence::UP;
			case 'B': /* Down */
				return EscapeSequence::DOWN;
			case 'C': /* Right */
				return EscapeSequence::RIGHT;
			case 'D': /* Left */
				return EscapeSequence::LEFT;
			case 'H': /* Home */
				return EscapeSequence::HOME;
			case 'F': /* End*/
				return EscapeSequence::END;
			case 'c':
				return EscapeSequence::ALT_F;
			case 'd':
				return EscapeSequence::ALT_B;
			default:
				Linenoise::Log("unrecognized escape sequence (O) %d\n", seq[1]);
				break;
			}
		} else if (seq[0] == '[') {
			switch (seq[1]) {
			case 'A': /* Up */
				return EscapeSequence::UP;
			case 'B': /* Down */
				return EscapeSequence::DOWN;
			case 'C': /* Right */
				return EscapeSequence::RIGHT;
			case 'D': /* Left */
				return EscapeSequence::LEFT;
			case 'H': /* Home */
				return EscapeSequence::HOME;
			case 'F': /* End*/
				return EscapeSequence::END;
			case 'Z': /* Shift Tab */
				return EscapeSequence::SHIFT_TAB;
			default:
				Linenoise::Log("unrecognized escape sequence (seq[1]) %d\n", seq[1]);
				break;
			}
		} else {
			Linenoise::Log("unrecognized escape sequence of length %d (%d %d)\n", length, seq[0], seq[1]);
		}
		break;
	case 3:
		if (seq[2] == '~') {
			switch (seq[1]) {
			case '1':
				return EscapeSequence::HOME;
			case '3': /* Delete key. */
				return EscapeSequence::DELETE;
			case '4':
			case '8':
				return EscapeSequence::END;
			default:
				Linenoise::Log("unrecognized escape sequence (~) %d\n", seq[1]);
				break;
			}
		} else if (seq[1] == '5' && seq[2] == 'C') {
			return EscapeSequence::ALT_F;
		} else if (seq[1] == '5' && seq[2] == 'D') {
			return EscapeSequence::ALT_B;
		} else {
			Linenoise::Log("unrecognized escape sequence of length %d\n", length);
		}
		break;
	case 5:
		if (memcmp(seq, "[1;5C", 5) == 0 || memcmp(seq, "[1;3C", 5) == 0) {
			// [1;5C: move word right
			return EscapeSequence::CTRL_MOVE_FORWARDS;
		} else if (memcmp(seq, "[1;5D", 5) == 0 || memcmp(seq, "[1;3D", 5) == 0) {
			// [1;5D: move word left
			return EscapeSequence::CTRL_MOVE_BACKWARDS;
		} else {
			Linenoise::Log("unrecognized escape sequence (;) %d\n", seq[1]);
		}
		break;
	default:
		Linenoise::Log("unrecognized escape sequence of length %d\n", length);
		break;
	}
	return EscapeSequence::UNKNOWN;
}